

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialSurface.cpp
# Opt level: O2

shared_ptr<chrono::ChMaterialSurface> __thiscall
chrono::ChMaterialSurface::DefaultMaterial(ChMaterialSurface *this,ChContactMethod contact_method)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<chrono::ChMaterialSurface> sVar2;
  _func_int **local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  if (contact_method == SMC) {
    std::make_shared<chrono::ChMaterialSurfaceSMC>();
  }
  else {
    if (contact_method != NSC) {
      this->_vptr_ChMaterialSurface = (_func_int **)0x0;
      this->static_friction = 0.0;
      this->sliding_friction = 0.0;
      goto LAB_00abaaf5;
    }
    std::make_shared<chrono::ChMaterialSurfaceNSC>();
  }
  _Var1._M_pi = _Stack_10._M_pi;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_ChMaterialSurface = local_18;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->static_friction = _Var1._M_pi;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_10);
  in_RDX._M_pi = extraout_RDX;
LAB_00abaaf5:
  sVar2.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = in_RDX._M_pi;
  sVar2.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<chrono::ChMaterialSurface>)
         sVar2.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChMaterialSurface> ChMaterialSurface::DefaultMaterial(ChContactMethod contact_method) {
    switch (contact_method) {
        case ChContactMethod::NSC:
            return chrono_types::make_shared<ChMaterialSurfaceNSC>();
        case ChContactMethod::SMC:
            return chrono_types::make_shared<ChMaterialSurfaceSMC>();
    }
    return nullptr;
}